

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

double incircleslow(double *pa,double *pb,double *pc,double *pd)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double b;
  double dVar15;
  double dVar16;
  double b_00;
  double dVar17;
  double dVar18;
  double b_01;
  double dVar19;
  double b_02;
  double b_03;
  double b_04;
  double b_05;
  double dVar20;
  double b_06;
  double dVar21;
  double dVar22;
  double dVar23;
  double b_07;
  double dVar24;
  double dVar25;
  double dVar26;
  double b_08;
  double dVar27;
  double b_09;
  double dVar28;
  double b_10;
  double dVar29;
  double dStack_8650;
  double local_8638;
  double local_8630;
  double dStack_8628;
  double local_8620;
  double dStack_8618;
  double local_8610;
  double dStack_8608;
  double local_8600;
  double local_85f8;
  double local_85f0;
  double dStack_85e8;
  double local_85e0;
  double dStack_85d8;
  double local_85d0;
  double dStack_85c8;
  double local_85c0;
  double local_85b8;
  double local_85b0;
  double dStack_85a8;
  double local_85a0;
  double dStack_8598;
  double local_8590;
  double dStack_8588;
  double local_8580;
  double local_8578;
  double local_8570;
  double dStack_8568;
  double local_8560;
  double dStack_8558;
  double local_8550;
  double dStack_8548;
  double local_8540;
  double temp16 [16];
  double detyyt [64];
  double detyt [32];
  double detxxt [64];
  double detxt [32];
  double local_7eb8;
  double local_7eb0;
  double dStack_7ea8;
  double local_7ea0;
  double dStack_7e98;
  double local_7e90;
  double dStack_7e88;
  double local_7e80;
  double local_7e78;
  double local_7e70;
  double dStack_7e68;
  double local_7e60;
  double dStack_7e58;
  double local_7e50;
  double dStack_7e48;
  double local_7e40;
  double detyy [64];
  double dety [32];
  double detxx [64];
  double detx [32];
  double detytyt [64];
  double detxtxt [64];
  double x2 [192];
  double y1 [128];
  double x1 [128];
  double y2 [192];
  double bdet [384];
  double adet [384];
  double cdet [384];
  double deter [1152];
  double abdet [768];
  
  dVar13 = *pa;
  dVar18 = *pb;
  dVar10 = pb[1];
  dVar11 = pc[1];
  dVar12 = *pd;
  dVar14 = pd[1];
  b_02 = dVar13 - dVar12;
  b_06 = (dVar13 - (b_02 + (dVar13 - b_02))) + ((dVar13 - b_02) - dVar12);
  b_10 = dVar18 - dVar12;
  b_09 = (dVar18 - (b_10 + (dVar18 - b_10))) + ((dVar18 - b_10) - dVar12);
  b_08 = dVar10 - dVar14;
  b_03 = (dVar10 - (b_08 + (dVar10 - b_08))) + ((dVar10 - b_08) - dVar14);
  dVar13 = pa[1];
  dVar18 = *pc;
  b_00 = dVar13 - dVar14;
  b_01 = dVar18 - dVar12;
  b_04 = (dVar13 - (b_00 + (dVar13 - b_00))) + ((dVar13 - b_00) - dVar14);
  b_05 = (dVar18 - (b_01 + (dVar18 - b_01))) + ((dVar18 - b_01) - dVar12);
  b = dVar11 - dVar14;
  b_07 = (dVar11 - (b + (dVar11 - b))) + ((dVar11 - b) - dVar14);
  dVar10 = b_06 * splitter - (b_06 * splitter - b_06);
  dVar11 = b_02 * splitter - (b_02 * splitter - b_02);
  dVar15 = splitter * b_03 - (splitter * b_03 - b_03);
  dVar16 = splitter * b_08 - (splitter * b_08 - b_08);
  dVar12 = b_06 * b_03;
  dVar14 = b_06 * b_08;
  dVar21 = b_06 - dVar10;
  dVar17 = b_03 - dVar15;
  dVar19 = b_08 - dVar16;
  local_8578 = dVar21 * dVar17 - (((dVar12 - dVar10 * dVar15) - dVar21 * dVar15) - dVar10 * dVar17);
  dVar26 = b_02 - dVar11;
  auVar1._8_4_ = SUB84(b_02,0);
  auVar1._0_8_ = b_02;
  auVar1._12_4_ = (int)((ulong)b_02 >> 0x20);
  dVar13 = b_02 * b_03;
  dVar18 = b_02 * b_08;
  dVar24 = dVar26 * dVar17 - (((dVar13 - dVar11 * dVar15) - dVar26 * dVar15) - dVar11 * dVar17);
  dVar25 = dVar26 * dVar19 - (((dVar18 - dVar11 * dVar16) - dVar26 * dVar16) - dVar11 * dVar19);
  dVar17 = dVar12 + dVar24;
  dVar20 = dVar14 + dVar25;
  dVar22 = dVar13 + dVar17;
  dVar23 = dVar17 - (dVar22 - dVar13);
  dVar15 = dVar19 * dVar21 - (((dVar14 - dVar10 * dVar16) - dVar16 * dVar21) - dVar10 * dVar19);
  dVar13 = (dVar12 - (dVar17 - (dVar17 - dVar12))) + (dVar24 - (dVar17 - dVar12));
  dVar12 = (dVar14 - (dVar20 - (dVar20 - dVar14))) + (dVar25 - (dVar20 - dVar14));
  dVar19 = dVar15 + dVar13;
  dVar17 = dVar23 + dVar19;
  dVar16 = (dVar23 - (dVar17 - (dVar17 - dVar23))) + (dVar19 - (dVar17 - dVar23));
  dVar14 = dVar22 + dVar17;
  dVar17 = (dVar22 - (dVar14 - (dVar14 - dVar22))) + (dVar17 - (dVar14 - dVar22));
  dVar22 = dVar12 + dVar16;
  local_8570 = (dVar15 - (dVar19 - dVar13)) + (dVar13 - (dVar19 - (dVar19 - dVar13)));
  dStack_8568 = (dVar16 - (dVar22 - (dVar22 - dVar16))) + (dVar12 - (dVar22 - dVar16));
  dVar16 = dVar18 + dVar20;
  dVar15 = dVar17 + dVar22;
  dVar12 = dVar14 + dVar15;
  dVar14 = (dVar14 - (dVar12 - (dVar12 - dVar14))) + (dVar15 - (dVar12 - dVar14));
  dVar13 = (dVar18 - (dVar16 - (dVar16 - dVar18))) + (dVar20 - (dVar16 - dVar18));
  dVar18 = (dVar17 - (dVar15 - (dVar15 - dVar17))) + (dVar22 - (dVar15 - dVar17));
  dVar19 = dVar18 + dVar13;
  dVar15 = dVar14 + dVar19;
  dVar14 = (dVar14 - (dVar15 - (dVar15 - dVar14))) + (dVar19 - (dVar15 - dVar14));
  dVar17 = dVar12 + dVar15;
  dVar12 = (dVar12 - (dVar17 - (dVar17 - dVar12))) + (dVar15 - (dVar17 - dVar12));
  dVar15 = dVar14 + dVar16;
  local_8560 = (dVar18 - (dVar19 - (dVar19 - dVar18))) + (dVar13 - (dVar19 - dVar18));
  dStack_8558 = (dVar14 - (dVar15 - (dVar15 - dVar14))) + (dVar16 - (dVar15 - dVar14));
  dVar13 = dVar12 + dVar15;
  local_8540 = dVar17 + dVar13;
  local_8550 = (dVar12 - (dVar13 - (dVar13 - dVar12))) + (dVar15 - (dVar13 - dVar12));
  dStack_8548 = (dVar17 - (local_8540 - (local_8540 - dVar17))) + (dVar13 - (local_8540 - dVar17));
  dVar23 = splitter * b_09 - (splitter * b_09 - b_09);
  dVar29 = b_10 * splitter - (b_10 * splitter - b_10);
  dVar19 = -b_04;
  dVar20 = -b_00;
  dVar13 = splitter * dVar19 - (b_04 + splitter * dVar19);
  dVar18 = splitter * dVar20 - (b_00 + splitter * dVar20);
  dVar12 = b_09 * dVar19;
  dVar14 = b_09 * dVar20;
  dVar28 = b_09 - dVar23;
  dVar15 = dVar19 - dVar13;
  dVar24 = dVar20 - dVar18;
  local_85f8 = dVar28 * dVar15 - (((dVar12 - dVar23 * dVar13) - dVar28 * dVar13) - dVar23 * dVar15);
  dVar22 = b_10 - dVar29;
  dVar19 = dVar19 * b_10;
  dVar20 = dVar20 * b_10;
  dVar25 = dVar22 * dVar15 - (((dVar19 - dVar29 * dVar13) - dVar22 * dVar13) - dVar29 * dVar15);
  dVar27 = dVar22 * dVar24 - (((dVar20 - dVar29 * dVar18) - dVar22 * dVar18) - dVar29 * dVar24);
  dVar16 = dVar12 + dVar25;
  dVar17 = dVar14 + dVar27;
  dVar15 = dVar19 + dVar16;
  dVar13 = dVar16 - (dVar15 - dVar19);
  dVar19 = dVar24 * dVar28 - (((dVar14 - dVar23 * dVar18) - dVar18 * dVar28) - dVar23 * dVar24);
  dVar18 = (dVar12 - (dVar16 - (dVar16 - dVar12))) + (dVar25 - (dVar16 - dVar12));
  dVar12 = (dVar14 - (dVar17 - (dVar17 - dVar14))) + (dVar27 - (dVar17 - dVar14));
  dVar16 = dVar19 + dVar18;
  dVar14 = dVar13 + dVar16;
  dVar24 = (dVar13 - (dVar14 - (dVar14 - dVar13))) + (dVar16 - (dVar14 - dVar13));
  dVar13 = dVar15 + dVar14;
  dVar14 = (dVar15 - (dVar13 - (dVar13 - dVar15))) + (dVar14 - (dVar13 - dVar15));
  dVar15 = dVar12 + dVar24;
  local_85f0 = (dVar19 - (dVar16 - dVar18)) + (dVar18 - (dVar16 - (dVar16 - dVar18)));
  dStack_85e8 = (dVar24 - (dVar15 - (dVar15 - dVar24))) + (dVar12 - (dVar15 - dVar24));
  dVar19 = dVar20 + dVar17;
  dVar12 = dVar14 + dVar15;
  dVar18 = dVar13 + dVar12;
  dVar13 = (dVar13 - (dVar18 - (dVar18 - dVar13))) + (dVar12 - (dVar18 - dVar13));
  dVar16 = (dVar20 - (dVar19 - (dVar19 - dVar20))) + (dVar17 - (dVar19 - dVar20));
  dVar17 = (dVar14 - (dVar12 - (dVar12 - dVar14))) + (dVar15 - (dVar12 - dVar14));
  dVar15 = dVar17 + dVar16;
  dVar12 = dVar13 + dVar15;
  dVar13 = (dVar13 - (dVar12 - (dVar12 - dVar13))) + (dVar15 - (dVar12 - dVar13));
  dVar14 = dVar18 + dVar12;
  dVar12 = (dVar18 - (dVar14 - (dVar14 - dVar18))) + (dVar12 - (dVar14 - dVar18));
  dVar18 = dVar13 + dVar19;
  local_85e0 = (dVar17 - (dVar15 - (dVar15 - dVar17))) + (dVar16 - (dVar15 - dVar17));
  dStack_85d8 = (dVar13 - (dVar18 - (dVar18 - dVar13))) + (dVar19 - (dVar18 - dVar13));
  dVar13 = dVar12 + dVar18;
  local_85c0 = dVar14 + dVar13;
  local_85d0 = (dVar12 - (dVar13 - (dVar13 - dVar12))) + (dVar18 - (dVar13 - dVar12));
  dStack_85c8 = (dVar14 - (local_85c0 - (local_85c0 - dVar14))) + (dVar13 - (local_85c0 - dVar14));
  dVar13 = splitter * b_07 - (splitter * b_07 - b_07);
  dVar18 = splitter * b - (splitter * b - b);
  dVar16 = b_09 * b_07;
  dVar19 = b_09 * b;
  dVar12 = b_07 - dVar13;
  dVar24 = b - dVar18;
  local_7e78 = dVar28 * dVar12 - (((dVar16 - dVar23 * dVar13) - dVar28 * dVar13) - dVar23 * dVar12);
  dVar15 = b_10 * b_07;
  dVar25 = b_10 * b;
  dVar17 = dVar22 * dVar12 - (((dVar15 - dVar29 * dVar13) - dVar22 * dVar13) - dVar29 * dVar12);
  dVar20 = dVar22 * dVar24 - (((dVar25 - dVar29 * dVar18) - dVar22 * dVar18) - dVar29 * dVar24);
  dVar13 = dVar16 + dVar17;
  dVar12 = dVar19 + dVar20;
  dVar14 = dVar15 + dVar13;
  dVar15 = dVar13 - (dVar14 - dVar15);
  dVar22 = dVar24 * dVar28 - (((dVar19 - dVar23 * dVar18) - dVar18 * dVar28) - dVar23 * dVar24);
  dVar17 = (dVar16 - (dVar13 - (dVar13 - dVar16))) + (dVar17 - (dVar13 - dVar16));
  dVar19 = (dVar19 - (dVar12 - (dVar12 - dVar19))) + (dVar20 - (dVar12 - dVar19));
  dVar16 = dVar22 + dVar17;
  dVar18 = dVar15 + dVar16;
  dVar15 = (dVar15 - (dVar18 - (dVar18 - dVar15))) + (dVar16 - (dVar18 - dVar15));
  dVar13 = dVar14 + dVar18;
  dVar18 = (dVar14 - (dVar13 - (dVar13 - dVar14))) + (dVar18 - (dVar13 - dVar14));
  dVar20 = dVar19 + dVar15;
  local_7e70 = (dVar22 - (dVar16 - dVar17)) + (dVar17 - (dVar16 - (dVar16 - dVar17)));
  dStack_7e68 = (dVar15 - (dVar20 - (dVar20 - dVar15))) + (dVar19 - (dVar20 - dVar15));
  dVar15 = dVar25 + dVar12;
  dVar16 = dVar18 + dVar20;
  dVar14 = dVar13 + dVar16;
  dVar13 = (dVar13 - (dVar14 - (dVar14 - dVar13))) + (dVar16 - (dVar14 - dVar13));
  dVar17 = (dVar25 - (dVar15 - (dVar15 - dVar25))) + (dVar12 - (dVar15 - dVar25));
  dVar19 = (dVar18 - (dVar16 - (dVar16 - dVar18))) + (dVar20 - (dVar16 - dVar18));
  dVar16 = dVar19 + dVar17;
  dVar18 = dVar13 + dVar16;
  dVar13 = (dVar13 - (dVar18 - (dVar18 - dVar13))) + (dVar16 - (dVar18 - dVar13));
  dVar12 = dVar14 + dVar18;
  dVar14 = (dVar14 - (dVar12 - (dVar12 - dVar14))) + (dVar18 - (dVar12 - dVar14));
  dVar18 = dVar13 + dVar15;
  local_7e60 = (dVar19 - (dVar16 - (dVar16 - dVar19))) + (dVar17 - (dVar16 - dVar19));
  dStack_7e58 = (dVar13 - (dVar18 - (dVar18 - dVar13))) + (dVar15 - (dVar18 - dVar13));
  dVar13 = dVar14 + dVar18;
  local_7e40 = dVar12 + dVar13;
  local_7e50 = (dVar14 - (dVar13 - (dVar13 - dVar14))) + (dVar18 - (dVar13 - dVar14));
  dStack_7e48 = (dVar12 - (local_7e40 - (local_7e40 - dVar12))) + (dVar13 - (local_7e40 - dVar12));
  dVar27 = splitter * b_05 - (splitter * b_05 - b_05);
  dVar29 = splitter * b_01 - (splitter * b_01 - b_01);
  dVar19 = -b_03;
  dVar25 = -b_08;
  dVar16 = splitter * dVar19 - (splitter * dVar19 + b_03);
  dVar17 = splitter * dVar25 - (b_08 + splitter * dVar25);
  dVar14 = b_05 * dVar19;
  dVar15 = b_05 * dVar25;
  dVar28 = b_05 - dVar27;
  dVar18 = b_01 * dVar19;
  dVar12 = b_01 * dVar25;
  dVar19 = dVar19 - dVar16;
  dVar25 = dVar25 - dVar17;
  local_7eb8 = dVar28 * dVar19 - (((dVar14 - dVar27 * dVar16) - dVar28 * dVar16) - dVar27 * dVar19);
  dVar13 = b_01 - dVar29;
  dVar23 = dVar13 * dVar19 - (((dVar18 - dVar29 * dVar16) - dVar13 * dVar16) - dVar29 * dVar19);
  dVar24 = dVar13 * dVar25 - (((dVar12 - dVar29 * dVar17) - dVar13 * dVar17) - dVar29 * dVar25);
  dVar16 = dVar14 + dVar23;
  dVar19 = dVar15 + dVar24;
  dVar20 = dVar18 + dVar16;
  dVar22 = dVar16 - (dVar20 - dVar18);
  dVar25 = dVar25 * dVar28 - (((dVar15 - dVar27 * dVar17) - dVar17 * dVar28) - dVar27 * dVar25);
  dVar18 = (dVar14 - (dVar16 - (dVar16 - dVar14))) + (dVar23 - (dVar16 - dVar14));
  dVar14 = (dVar15 - (dVar19 - (dVar19 - dVar15))) + (dVar24 - (dVar19 - dVar15));
  dVar17 = dVar25 + dVar18;
  dVar16 = dVar22 + dVar17;
  dVar22 = (dVar22 - (dVar16 - (dVar16 - dVar22))) + (dVar17 - (dVar16 - dVar22));
  dVar15 = dVar20 + dVar16;
  dVar16 = (dVar20 - (dVar15 - (dVar15 - dVar20))) + (dVar16 - (dVar15 - dVar20));
  dVar23 = dVar14 + dVar22;
  local_7eb0 = (dVar25 - (dVar17 - dVar18)) + (dVar18 - (dVar17 - (dVar17 - dVar18)));
  dStack_7ea8 = (dVar22 - (dVar23 - (dVar23 - dVar22))) + (dVar14 - (dVar23 - dVar22));
  dVar20 = dVar12 + dVar19;
  dVar17 = dVar16 + dVar23;
  dVar14 = dVar15 + dVar17;
  dVar15 = (dVar15 - (dVar14 - (dVar14 - dVar15))) + (dVar17 - (dVar14 - dVar15));
  dVar18 = (dVar12 - (dVar20 - (dVar20 - dVar12))) + (dVar19 - (dVar20 - dVar12));
  dVar12 = (dVar16 - (dVar17 - (dVar17 - dVar16))) + (dVar23 - (dVar17 - dVar16));
  dVar19 = dVar12 + dVar18;
  dVar16 = dVar15 + dVar19;
  dVar15 = (dVar15 - (dVar16 - (dVar16 - dVar15))) + (dVar19 - (dVar16 - dVar15));
  dVar17 = dVar14 + dVar16;
  dVar14 = (dVar14 - (dVar17 - (dVar17 - dVar14))) + (dVar16 - (dVar17 - dVar14));
  dVar16 = dVar15 + dVar20;
  local_7ea0 = (dVar12 - (dVar19 - (dVar19 - dVar12))) + (dVar18 - (dVar19 - dVar12));
  dStack_7e98 = (dVar15 - (dVar16 - (dVar16 - dVar15))) + (dVar20 - (dVar16 - dVar15));
  dVar18 = dVar14 + dVar16;
  local_7e80 = dVar17 + dVar18;
  local_7e90 = (dVar14 - (dVar18 - (dVar18 - dVar14))) + (dVar16 - (dVar18 - dVar14));
  dStack_7e88 = (dVar17 - (local_7e80 - (local_7e80 - dVar17))) + (dVar18 - (local_7e80 - dVar17));
  dVar18 = splitter * b_04 - (splitter * b_04 - b_04);
  dVar19 = splitter * b_00 - (splitter * b_00 - b_00);
  dVar12 = b_05 * b_04;
  dVar14 = b_00 * b_05;
  dVar20 = b_01 * b_04;
  dVar23 = b_01 * b_00;
  dVar15 = b_04 - dVar18;
  dVar22 = b_00 - dVar19;
  local_8638 = dVar28 * dVar15 - (((dVar12 - dVar27 * dVar18) - dVar28 * dVar18) - dVar27 * dVar15);
  dVar18 = dVar13 * dVar15 - (((dVar20 - dVar29 * dVar18) - dVar13 * dVar18) - dVar29 * dVar15);
  dVar13 = dVar13 * dVar22 - (((dVar23 - dVar29 * dVar19) - dVar13 * dVar19) - dVar29 * dVar22);
  dVar15 = dVar12 + dVar18;
  dVar16 = dVar14 + dVar13;
  dVar17 = dVar20 + dVar15;
  dVar20 = dVar15 - (dVar17 - dVar20);
  dVar22 = dVar22 * dVar28 - (((dVar14 - dVar27 * dVar19) - dVar19 * dVar28) - dVar27 * dVar22);
  dVar18 = (dVar12 - (dVar15 - (dVar15 - dVar12))) + (dVar18 - (dVar15 - dVar12));
  dVar12 = (dVar14 - (dVar16 - (dVar16 - dVar14))) + (dVar13 - (dVar16 - dVar14));
  dVar15 = dVar22 + dVar18;
  dVar14 = dVar20 + dVar15;
  dVar19 = (dVar20 - (dVar14 - (dVar14 - dVar20))) + (dVar15 - (dVar14 - dVar20));
  dVar13 = dVar17 + dVar14;
  dVar14 = (dVar17 - (dVar13 - (dVar13 - dVar17))) + (dVar14 - (dVar13 - dVar17));
  dVar17 = dVar12 + dVar19;
  local_8630 = (dVar22 - (dVar15 - dVar18)) + (dVar18 - (dVar15 - (dVar15 - dVar18)));
  dStack_8628 = (dVar19 - (dVar17 - (dVar17 - dVar19))) + (dVar12 - (dVar17 - dVar19));
  dVar15 = dVar23 + dVar16;
  dVar12 = dVar14 + dVar17;
  dVar18 = dVar13 + dVar12;
  dVar13 = (dVar13 - (dVar18 - (dVar18 - dVar13))) + (dVar12 - (dVar18 - dVar13));
  dVar19 = (dVar23 - (dVar15 - (dVar15 - dVar23))) + (dVar16 - (dVar15 - dVar23));
  dVar17 = (dVar14 - (dVar12 - (dVar12 - dVar14))) + (dVar17 - (dVar12 - dVar14));
  dVar16 = dVar17 + dVar19;
  dVar12 = dVar13 + dVar16;
  dVar13 = (dVar13 - (dVar12 - (dVar12 - dVar13))) + (dVar16 - (dVar12 - dVar13));
  dVar14 = dVar18 + dVar12;
  dVar12 = (dVar18 - (dVar14 - (dVar14 - dVar18))) + (dVar12 - (dVar14 - dVar18));
  dVar18 = dVar13 + dVar15;
  local_8620 = (dVar17 - (dVar16 - (dVar16 - dVar17))) + (dVar19 - (dVar16 - dVar17));
  dStack_8618 = (dVar13 - (dVar18 - (dVar18 - dVar13))) + (dVar15 - (dVar18 - dVar13));
  dVar13 = dVar12 + dVar18;
  local_8600 = dVar14 + dVar13;
  local_8610 = (dVar12 - (dVar13 - (dVar13 - dVar12))) + (dVar18 - (dVar13 - dVar12));
  dStack_8608 = (dVar14 - (local_8600 - (local_8600 - dVar14))) + (dVar13 - (local_8600 - dVar14));
  dVar18 = -b_07;
  dVar22 = -b;
  dVar13 = splitter * dVar18 - (splitter * dVar18 + b_07);
  dVar14 = splitter * dVar22 - (b + splitter * dVar22);
  dVar19 = b_06 * dVar18;
  dVar20 = b_06 * dVar22;
  dStack_8650 = auVar1._8_8_;
  dVar15 = b_02 * dVar18;
  dStack_8650 = dStack_8650 * dVar22;
  dVar18 = dVar18 - dVar13;
  dVar22 = dVar22 - dVar14;
  local_85b8 = dVar21 * dVar18 - (((dVar19 - dVar10 * dVar13) - dVar21 * dVar13) - dVar10 * dVar18);
  dVar16 = dVar26 * dVar18 - (((dVar15 - dVar11 * dVar13) - dVar26 * dVar13) - dVar11 * dVar18);
  dVar17 = dVar26 * dVar22 - (((dStack_8650 - dVar11 * dVar14) - dVar26 * dVar14) - dVar11 * dVar22)
  ;
  dVar18 = dVar19 + dVar16;
  dVar11 = dVar20 + dVar17;
  dVar12 = dVar15 + dVar18;
  dVar13 = dVar18 - (dVar12 - dVar15);
  dVar15 = dVar22 * dVar21 - (((dVar20 - dVar10 * dVar14) - dVar14 * dVar21) - dVar10 * dVar22);
  dVar19 = (dVar19 - (dVar18 - (dVar18 - dVar19))) + (dVar16 - (dVar18 - dVar19));
  dVar17 = (dVar20 - (dVar11 - (dVar11 - dVar20))) + (dVar17 - (dVar11 - dVar20));
  dVar10 = dVar15 + dVar19;
  dVar18 = dVar13 + dVar10;
  dVar14 = (dVar13 - (dVar18 - (dVar18 - dVar13))) + (dVar10 - (dVar18 - dVar13));
  dVar13 = dVar12 + dVar18;
  dVar18 = (dVar12 - (dVar13 - (dVar13 - dVar12))) + (dVar18 - (dVar13 - dVar12));
  dVar16 = dVar17 + dVar14;
  local_85b0 = (dVar15 - (dVar10 - dVar19)) + (dVar19 - (dVar10 - (dVar10 - dVar19)));
  dStack_85a8 = (dVar14 - (dVar16 - (dVar16 - dVar14))) + (dVar17 - (dVar16 - dVar14));
  dVar14 = dStack_8650 + dVar11;
  dVar10 = dVar18 + dVar16;
  dVar12 = dVar13 + dVar10;
  dVar13 = (dVar13 - (dVar12 - (dVar12 - dVar13))) + (dVar10 - (dVar12 - dVar13));
  dVar17 = (dStack_8650 - (dVar14 - (dVar14 - dStack_8650))) + (dVar11 - (dVar14 - dStack_8650));
  dVar16 = (dVar18 - (dVar10 - (dVar10 - dVar18))) + (dVar16 - (dVar10 - dVar18));
  dVar15 = dVar16 + dVar17;
  dVar18 = dVar13 + dVar15;
  dVar13 = (dVar13 - (dVar18 - (dVar18 - dVar13))) + (dVar15 - (dVar18 - dVar13));
  dVar10 = dVar12 + dVar18;
  dVar11 = (dVar12 - (dVar10 - (dVar10 - dVar12))) + (dVar18 - (dVar10 - dVar12));
  dVar18 = dVar13 + dVar14;
  local_85a0 = (dVar16 - (dVar15 - (dVar15 - dVar16))) + (dVar17 - (dVar15 - dVar16));
  dStack_8598 = (dVar13 - (dVar18 - (dVar18 - dVar13))) + (dVar14 - (dVar18 - dVar13));
  dVar13 = dVar11 + dVar18;
  local_8580 = dVar10 + dVar13;
  local_8590 = (dVar11 - (dVar13 - (dVar13 - dVar11))) + (dVar18 - (dVar13 - dVar11));
  dStack_8588 = (dVar10 - (local_8580 - (local_8580 - dVar10))) + (dVar13 - (local_8580 - dVar10));
  iVar2 = fast_expansion_sum_zeroelim(8,&local_7e78,8,&local_7eb8,temp16);
  iVar3 = scale_expansion_zeroelim(iVar2,temp16,b_02,detx);
  iVar3 = scale_expansion_zeroelim(iVar3,detx,b_02,detxx);
  iVar4 = scale_expansion_zeroelim(iVar2,temp16,b_06,detxt);
  uVar5 = scale_expansion_zeroelim(iVar4,detxt,b_02,detxxt);
  uVar8 = 0;
  uVar9 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar9 = 0;
  }
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    detxxt[uVar8] = detxxt[uVar8] + detxxt[uVar8];
  }
  iVar4 = scale_expansion_zeroelim(iVar4,detxt,b_06,detxtxt);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,detxx,uVar5,detxxt,x1);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,x1,iVar4,detxtxt,x2);
  iVar4 = scale_expansion_zeroelim(iVar2,temp16,b_00,dety);
  iVar4 = scale_expansion_zeroelim(iVar4,dety,b_00,detyy);
  iVar2 = scale_expansion_zeroelim(iVar2,temp16,b_04,detyt);
  uVar5 = scale_expansion_zeroelim(iVar2,detyt,b_00,detyyt);
  uVar8 = 0;
  uVar9 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar9 = 0;
  }
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    detyyt[uVar8] = detyyt[uVar8] + detyyt[uVar8];
  }
  iVar2 = scale_expansion_zeroelim(iVar2,detyt,b_04,detytyt);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,detyy,uVar5,detyyt,y1);
  iVar2 = fast_expansion_sum_zeroelim(iVar4,y1,iVar2,detytyt,y2);
  iVar2 = fast_expansion_sum_zeroelim(iVar3,x2,iVar2,y2,adet);
  iVar3 = fast_expansion_sum_zeroelim(8,&local_8638,8,&local_85b8,temp16);
  iVar4 = scale_expansion_zeroelim(iVar3,temp16,b_10,detx);
  iVar4 = scale_expansion_zeroelim(iVar4,detx,b_10,detxx);
  iVar6 = scale_expansion_zeroelim(iVar3,temp16,b_09,detxt);
  uVar5 = scale_expansion_zeroelim(iVar6,detxt,b_10,detxxt);
  uVar8 = 0;
  uVar9 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar9 = 0;
  }
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    detxxt[uVar8] = detxxt[uVar8] + detxxt[uVar8];
  }
  iVar6 = scale_expansion_zeroelim(iVar6,detxt,b_09,detxtxt);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,detxx,uVar5,detxxt,x1);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,x1,iVar6,detxtxt,x2);
  iVar6 = scale_expansion_zeroelim(iVar3,temp16,b_08,dety);
  iVar6 = scale_expansion_zeroelim(iVar6,dety,b_08,detyy);
  iVar3 = scale_expansion_zeroelim(iVar3,temp16,b_03,detyt);
  uVar5 = scale_expansion_zeroelim(iVar3,detyt,b_08,detyyt);
  uVar8 = 0;
  uVar9 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar9 = 0;
  }
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    detyyt[uVar8] = detyyt[uVar8] + detyyt[uVar8];
  }
  iVar3 = scale_expansion_zeroelim(iVar3,detyt,b_03,detytyt);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,detyy,uVar5,detyyt,y1);
  iVar3 = fast_expansion_sum_zeroelim(iVar6,y1,iVar3,detytyt,y2);
  iVar3 = fast_expansion_sum_zeroelim(iVar4,x2,iVar3,y2,bdet);
  iVar4 = fast_expansion_sum_zeroelim(8,&local_8578,8,&local_85f8,temp16);
  iVar6 = scale_expansion_zeroelim(iVar4,temp16,b_01,detx);
  iVar6 = scale_expansion_zeroelim(iVar6,detx,b_01,detxx);
  iVar7 = scale_expansion_zeroelim(iVar4,temp16,b_05,detxt);
  uVar5 = scale_expansion_zeroelim(iVar7,detxt,b_01,detxxt);
  uVar8 = 0;
  uVar9 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar9 = 0;
  }
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    detxxt[uVar8] = detxxt[uVar8] + detxxt[uVar8];
  }
  iVar7 = scale_expansion_zeroelim(iVar7,detxt,b_05,detxtxt);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,detxx,uVar5,detxxt,x1);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,x1,iVar7,detxtxt,x2);
  iVar7 = scale_expansion_zeroelim(iVar4,temp16,b,dety);
  iVar7 = scale_expansion_zeroelim(iVar7,dety,b,detyy);
  iVar4 = scale_expansion_zeroelim(iVar4,temp16,b_07,detyt);
  uVar5 = scale_expansion_zeroelim(iVar4,detyt,b,detyyt);
  uVar8 = 0;
  uVar9 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar9 = 0;
  }
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    detyyt[uVar8] = detyyt[uVar8] + detyyt[uVar8];
  }
  iVar4 = scale_expansion_zeroelim(iVar4,detyt,b_07,detytyt);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,detyy,uVar5,detyyt,y1);
  iVar4 = fast_expansion_sum_zeroelim(iVar7,y1,iVar4,detytyt,y2);
  iVar4 = fast_expansion_sum_zeroelim(iVar6,x2,iVar4,y2,cdet);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,adet,iVar3,bdet,abdet);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,abdet,iVar4,cdet,deter);
  return cdet[(long)iVar2 + 0x17f];
}

Assistant:

REAL incircleslow(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  INEXACT REAL adx, bdx, cdx, ady, bdy, cdy;
  REAL adxtail, bdxtail, cdxtail;
  REAL adytail, bdytail, cdytail;
  REAL negate, negatetail;
  INEXACT REAL axby7, bxcy7, axcy7, bxay7, cxby7, cxay7;
  REAL axby[8], bxcy[8], axcy[8], bxay[8], cxby[8], cxay[8];
  REAL temp16[16];
  int temp16len;
  REAL detx[32], detxx[64], detxt[32], detxxt[64], detxtxt[64];
  int xlen, xxlen, xtlen, xxtlen, xtxtlen;
  REAL x1[128], x2[192];
  int x1len, x2len;
  REAL dety[32], detyy[64], detyt[32], detyyt[64], detytyt[64];
  int ylen, yylen, ytlen, yytlen, ytytlen;
  REAL y1[128], y2[192];
  int y1len, y2len;
  REAL adet[384], bdet[384], cdet[384], abdet[768], deter[1152];
  int alen, blen, clen, ablen, deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL a0hi, a0lo, a1hi, a1lo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j, _k, _l, _m, _n;
  REAL _0, _1, _2;

  Two_Diff(pa[0], pd[0], adx, adxtail);
  Two_Diff(pa[1], pd[1], ady, adytail);
  Two_Diff(pb[0], pd[0], bdx, bdxtail);
  Two_Diff(pb[1], pd[1], bdy, bdytail);
  Two_Diff(pc[0], pd[0], cdx, cdxtail);
  Two_Diff(pc[1], pd[1], cdy, cdytail);

  Two_Two_Product(adx, adxtail, bdy, bdytail,
                  axby7, axby[6], axby[5], axby[4],
                  axby[3], axby[2], axby[1], axby[0]);
  axby[7] = axby7;
  negate = -ady;
  negatetail = -adytail;
  Two_Two_Product(bdx, bdxtail, negate, negatetail,
                  bxay7, bxay[6], bxay[5], bxay[4],
                  bxay[3], bxay[2], bxay[1], bxay[0]);
  bxay[7] = bxay7;
  Two_Two_Product(bdx, bdxtail, cdy, cdytail,
                  bxcy7, bxcy[6], bxcy[5], bxcy[4],
                  bxcy[3], bxcy[2], bxcy[1], bxcy[0]);
  bxcy[7] = bxcy7;
  negate = -bdy;
  negatetail = -bdytail;
  Two_Two_Product(cdx, cdxtail, negate, negatetail,
                  cxby7, cxby[6], cxby[5], cxby[4],
                  cxby[3], cxby[2], cxby[1], cxby[0]);
  cxby[7] = cxby7;
  Two_Two_Product(cdx, cdxtail, ady, adytail,
                  cxay7, cxay[6], cxay[5], cxay[4],
                  cxay[3], cxay[2], cxay[1], cxay[0]);
  cxay[7] = cxay7;
  negate = -cdy;
  negatetail = -cdytail;
  Two_Two_Product(adx, adxtail, negate, negatetail,
                  axcy7, axcy[6], axcy[5], axcy[4],
                  axcy[3], axcy[2], axcy[1], axcy[0]);
  axcy[7] = axcy7;


  temp16len = fast_expansion_sum_zeroelim(8, bxcy, 8, cxby, temp16);

  xlen = scale_expansion_zeroelim(temp16len, temp16, adx, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, adx, detxx);
  xtlen = scale_expansion_zeroelim(temp16len, temp16, adxtail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, adx, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, adxtail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);

  ylen = scale_expansion_zeroelim(temp16len, temp16, ady, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, ady, detyy);
  ytlen = scale_expansion_zeroelim(temp16len, temp16, adytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, ady, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, adytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);

  alen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, adet);


  temp16len = fast_expansion_sum_zeroelim(8, cxay, 8, axcy, temp16);

  xlen = scale_expansion_zeroelim(temp16len, temp16, bdx, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, bdx, detxx);
  xtlen = scale_expansion_zeroelim(temp16len, temp16, bdxtail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, bdx, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, bdxtail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);

  ylen = scale_expansion_zeroelim(temp16len, temp16, bdy, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, bdy, detyy);
  ytlen = scale_expansion_zeroelim(temp16len, temp16, bdytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, bdy, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, bdytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);

  blen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, bdet);


  temp16len = fast_expansion_sum_zeroelim(8, axby, 8, bxay, temp16);

  xlen = scale_expansion_zeroelim(temp16len, temp16, cdx, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, cdx, detxx);
  xtlen = scale_expansion_zeroelim(temp16len, temp16, cdxtail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, cdx, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, cdxtail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);

  ylen = scale_expansion_zeroelim(temp16len, temp16, cdy, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, cdy, detyy);
  ytlen = scale_expansion_zeroelim(temp16len, temp16, cdytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, cdy, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, cdytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);

  clen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, cdet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, clen, cdet, deter);

  return deter[deterlen - 1];
}